

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

void __thiscall
cppcms::url_mapper::real_map
          (url_mapper *this,char *ckey,streamable **params,size_t params_no,ostream *output)

{
  data *pdVar1;
  string_key *key_00;
  streamable **ppsVar2;
  undefined8 uVar3;
  size_type sVar4;
  url_mapper *puVar5;
  ulong uVar6;
  mapped_type *this_00;
  char *pcVar7;
  streamable **in_RCX;
  long in_RDX;
  data *in_RDI;
  steal_buffer<128UL> *in_R8;
  cppcms_error *e;
  ostringstream ss;
  uint i;
  streamable **key_params;
  size_t direct_size;
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mappings;
  url_mapper *mp;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> direct;
  string_key real_key;
  string_key key;
  steal_buffer<128UL> temp_buf;
  string *in_stack_fffffffffffffb08;
  steal_buffer<128UL> *in_stack_fffffffffffffb10;
  steal_buffer<128UL> *this_01;
  url_mapper *in_stack_fffffffffffffb18;
  steal_buffer<128UL> *in_stack_fffffffffffffb20;
  key_type *in_stack_fffffffffffffb48;
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb50;
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbd8;
  size_t in_stack_fffffffffffffbe0;
  allocator *paVar8;
  streamable **params_00;
  string_key *full_url;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  ostream *in_stack_fffffffffffffc18;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *in_stack_fffffffffffffc50;
  string_key *in_stack_fffffffffffffc58;
  string_key *in_stack_fffffffffffffc60;
  url_mapper *in_stack_fffffffffffffc68;
  long local_380 [47];
  uint local_204;
  long local_200;
  size_type local_1f8;
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  string_key *local_198;
  string_key local_190 [7];
  steal_buffer<128UL> *local_28;
  streamable **local_20;
  long local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  util::steal_buffer<128UL>::steal_buffer(in_stack_fffffffffffffb10);
  pdVar1 = booster::hold_ptr<cppcms::url_mapper::data>::operator->
                     ((hold_ptr<cppcms::url_mapper::data> *)in_RDI);
  if ((pdVar1->throws & 1U) == 0) {
    util::steal_buffer<128UL>::steal(in_stack_fffffffffffffb10,(ostream *)in_stack_fffffffffffffb08)
    ;
  }
  string_key::unowned((char *)in_stack_fffffffffffffb18);
  string_key::string_key((string_key *)0x3bc396);
  full_url = local_190;
  std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::vector
            ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)0x3bc3ad);
  key_00 = (string_key *)
           get_mapper_for_key(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                              in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  params_00 = local_20;
  local_198 = key_00;
  ppsVar2 = (streamable **)
            std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::size
                      ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)local_190)
  ;
  if (params_00 < ppsVar2) {
    local_1ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    paVar8 = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b8,"url_mapper: number of keywords is larger then number of actual parameters"
               ,paVar8);
    cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    local_1ba = 0;
    __cxa_throw(uVar3,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  std::
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x3bc563);
  sVar4 = std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::size
                    ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)local_190);
  if (sVar4 == 0) {
    booster::hold_ptr<cppcms::url_mapper::data>::operator->
              ((hold_ptr<cppcms::url_mapper::data> *)local_198);
    puVar5 = topmost(in_stack_fffffffffffffb18);
    booster::hold_ptr<cppcms::url_mapper::data>::operator->(&puVar5->d);
    this_01 = local_28;
    data::map(in_RDI,key_00,full_url,params_00,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
              (map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
              in_stack_fffffffffffffc18);
  }
  else {
    local_1f8 = std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::size
                          ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)
                           local_190);
    local_200 = local_18;
    local_18 = local_1f8 * 8 + local_18;
    local_20 = (streamable **)((long)local_20 - local_1f8);
    local_204 = 0;
    while( true ) {
      uVar6 = (ulong)local_204;
      sVar4 = std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::size
                        ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)
                         local_190);
      if (sVar4 <= uVar6) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
      std::ios::copyfmt((ios *)((long)local_380 + *(long *)(local_380[0] + -0x18)));
      filters::streamable::operator()
                ((streamable *)in_stack_fffffffffffffb10,(ostream *)in_stack_fffffffffffffb08);
      std::__cxx11::ostringstream::str();
      std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::operator[]
                ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)local_190,
                 (ulong)local_204);
      this_00 = std::
                map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xfffffffffffffc60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc60);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
      local_204 = local_204 + 1;
    }
    booster::hold_ptr<cppcms::url_mapper::data>::operator->
              ((hold_ptr<cppcms::url_mapper::data> *)local_198);
    puVar5 = topmost(in_stack_fffffffffffffb18);
    booster::hold_ptr<cppcms::url_mapper::data>::operator->(&puVar5->d);
    this_01 = local_28;
    data::map(in_RDI,key_00,full_url,params_00,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
              (map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
              in_stack_fffffffffffffc18);
  }
  std::
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x3bc8d9);
  std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::~vector
            ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)
             in_stack_fffffffffffffb20);
  string_key::~string_key((string_key *)0x3bc8f3);
  string_key::~string_key((string_key *)0x3bc900);
  pdVar1 = booster::hold_ptr<cppcms::url_mapper::data>::operator->
                     ((hold_ptr<cppcms::url_mapper::data> *)in_RDI);
  if ((pdVar1->throws & 1U) == 0) {
    util::steal_buffer<128UL>::release(this_01);
    pcVar7 = util::stackbuf<128UL>::c_str(&this_01->super_stackbuf<128UL>);
    std::operator<<((ostream *)local_28,pcVar7);
    in_stack_fffffffffffffb20 = local_28;
  }
  util::steal_buffer<128UL>::~steal_buffer(in_stack_fffffffffffffb20);
  return;
}

Assistant:

void url_mapper::real_map(	char const *ckey,
					filters::streamable const * const *params,
					size_t params_no,
					std::ostream &output)
	{
		util::steal_buffer<> temp_buf;
		if(!d->throws)
			temp_buf.steal(output);
		try {
			string_key key=string_key::unowned(ckey);
			string_key real_key;
			std::vector<string_key> direct;
			url_mapper &mp = get_mapper_for_key(key,real_key,direct);
			if(params_no < direct.size())
				throw cppcms_error("url_mapper: number of keywords is larger then number of actual parameters");
			std::map<string_key,std::string> mappings;
			if(direct.size() == 0) {
				mp.d->map(real_key,key,params,params_no,topmost().d->helpers,mappings,output);
			}
			else {
				size_t direct_size = direct.size();
				filters::streamable const * const *key_params = params;
				params += direct_size;
				params_no -= direct_size;
				for(unsigned i=0;i<direct.size();i++) {
					std::ostringstream ss;
					ss.copyfmt(output);
					(*key_params[i])(ss);
					mappings[direct[i]]=ss.str();
				}
				mp.d->map(real_key,key,params,params_no,topmost().d->helpers,mappings,output);
			}
		}
		catch(cppcms_error const &e) {
			if(d->throws) {
				throw;
			}
			BOOSTER_ERROR("cppcms") << e.what() <<'\n' << booster::trace(e);
			temp_buf.release();
			output<<"/this_is_an_invalid_url_generated_by_url_mapper";
			return;
		}
		if(!d->throws) {
			temp_buf.release();
			output << temp_buf.c_str();
		}
	}